

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_read_write_with_lock(char *file,kvtree *hash,int write)

{
  mode_t mode;
  int iVar1;
  undefined8 uVar2;
  char *fmt;
  
  if (file == (char *)0x0) {
    fmt = "No filename specified @ %s:%d";
    uVar2 = 0x5ea;
  }
  else {
    if (hash != (kvtree *)0x0) {
      mode = kvtree_getmode(1,1,0);
      iVar1 = kvtree_open_with_lock(file,0x42,mode,write);
      return iVar1;
    }
    fmt = "No hash provided to read data into @ %s:%d";
    uVar2 = 0x5f2;
  }
  kvtree_err(fmt,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
             ,uVar2);
  return -1;
}

Assistant:

static
int kvtree_read_write_with_lock(const char* file, kvtree* hash, int write)
{
  /* check that we got a filename */
  if (file == NULL) {
    kvtree_err("No filename specified @ %s:%d",
      __FILE__, __LINE__
    );
    return -1;
  }

  /* check that we got a hash to read data into */
  if (hash == NULL) {
    kvtree_err("No hash provided to read data into @ %s:%d",
      __FILE__, __LINE__
    );
    return -1;
  }

  /* open file with lock for read / write access */
  mode_t mode_file = kvtree_getmode(1, 1, 0);
  int fd = kvtree_open_with_lock(file, O_RDWR | O_CREAT, mode_file, write);

  return fd;
}